

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

_ElementType __thiscall
Lib::
CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>_>
::next(CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>_>
       *this)

{
  CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>_>
  *in_RDI;
  CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>_>
  *this_00;
  Node **local_8;
  
  this_00 = in_RDI;
  hasNext(in_RDI);
  if ((in_RDI->_first & 1U) == 0) {
    local_8 = IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>
              ::next((IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>_>
                      *)this_00);
  }
  else {
    local_8 = SingletonIterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Node_**>::next
                        (&in_RDI->_it1);
  }
  return local_8;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }